

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::Int32ToString_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,int number)

{
  allocator<char> local_15;
  int local_14;
  string *psStack_10;
  int number_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == -0x80000000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"(~0x7fffffff)",&local_15);
    std::allocator<char>::~allocator(&local_15);
  }
  else {
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)((ulong)this & 0xffffffff),number);
  }
  return __return_storage_ptr__;
}

Assistant:

string Int32ToString(int number) {
  // gcc rejects the decimal form of kint32min.
  if (number == kint32min) {
    GOOGLE_COMPILE_ASSERT(kint32min == (~0x7fffffff), kint32min_value_error);
    return "(~0x7fffffff)";
  } else {
    return SimpleItoa(number);
  }
}